

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall leveldb::VersionSet::~VersionSet(VersionSet *this)

{
  long *plVar1;
  long lVar2;
  Writer *this_00;
  long *plVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long lVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  Version::Unref(this->current_);
  if ((this->dummy_versions_).next_ != &this->dummy_versions_) {
    __assert_fail("dummy_versions_.next_ == &dummy_versions_",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x2f4,"leveldb::VersionSet::~VersionSet()");
  }
  this_00 = this->descriptor_log_;
  if (this_00 != (Writer *)0x0) {
    log::Writer::~Writer(this_00);
  }
  operator_delete(this_00,0x20);
  if (this->descriptor_file_ != (WritableFile *)0x0) {
    (*this->descriptor_file_->_vptr_WritableFile[1])();
  }
  lVar6 = 0;
  do {
    plVar1 = (long *)(this->compact_pointer_[6].field_2._M_local_buf + lVar6);
    plVar3 = *(long **)((long)&this->compact_pointer_[6]._M_dataplus._M_p + lVar6);
    if (plVar1 != plVar3) {
      operator_delete(plVar3,*plVar1 + 1);
    }
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0xe0);
  Version::~Version(&this->dummy_versions_);
  Comparator::~Comparator(&(this->icmp_).super_Comparator);
  pcVar4 = (this->dbname_)._M_dataplus._M_p;
  paVar5 = &(this->dbname_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar5) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    operator_delete(pcVar4,paVar5->_M_allocated_capacity + 1);
    return;
  }
  __stack_chk_fail();
}

Assistant:

VersionSet::~VersionSet() {
  current_->Unref();
  assert(dummy_versions_.next_ == &dummy_versions_);  // List must be empty
  delete descriptor_log_;
  delete descriptor_file_;
}